

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O1

void accum_global_gauden(vector_t ***acc,vector_t ***l_acc,gauden_t *g,uint32 *lcl2glb,
                        uint32 n_lcl2glb)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  vector_t pfVar5;
  vector_t pfVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if ((acc != (vector_t ***)0x0) && (n_lcl2glb != 0)) {
    uVar1 = g->n_feat;
    uVar2 = g->n_density;
    uVar9 = 0;
    do {
      if ((ulong)uVar1 != 0) {
        uVar3 = lcl2glb[uVar9];
        uVar7 = 0;
        do {
          if ((ulong)uVar2 != 0) {
            uVar4 = g->veclen[uVar7];
            uVar10 = 0;
            do {
              if ((ulong)uVar4 != 0) {
                pfVar5 = l_acc[uVar9][uVar7][uVar10];
                pfVar6 = acc[uVar3][uVar7][uVar10];
                uVar8 = 0;
                do {
                  pfVar6[uVar8] = pfVar5[uVar8] + pfVar6[uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar4 != uVar8);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar2);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar1);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != n_lcl2glb);
  }
  return;
}

Assistant:

void
accum_global_gauden(vector_t ***acc,
		    vector_t ***l_acc,
		    gauden_t *g,
		    uint32 *lcl2glb,
		    uint32 n_lcl2glb)
{
    uint32 n_feat;
    uint32 n_density;
    uint32 ii, i, j, k, l;

    if (acc == NULL) {
	/* nothing to do */

	return;
    }

    n_feat = gauden_n_feat(g);
    n_density = gauden_n_density(g);

    /* for each mixture density */
    for (ii = 0; ii < n_lcl2glb; ii++) {
	/* map local density id to global one */
	i = lcl2glb[ii];

	/* for each feature */
	for (j = 0; j < n_feat; j++) {

	    /* for each density in the mixture density */
	    for (k = 0; k < n_density; k++) {
		
		for (l = 0; l < g->veclen[j]; l++) {
		    acc[i][j][k][l] += l_acc[ii][j][k][l];
		}
	    }
	}
    }
}